

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic128.h
# Opt level: O2

void atomic16_set(Int128 *ptr,Int128 val)

{
  bool bVar1;
  bool bVar2;
  undefined1 cmp [16];
  undefined1 new [16];
  Int128 *pIVar3;
  long extraout_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  Int128 *ptr_00;
  undefined8 unaff_R13;
  long lVar4;
  undefined8 unaff_R14;
  
  lVar4 = *(long *)((long)ptr + 8);
  ptr_00 = *(Int128 **)ptr;
  do {
    cmp._8_8_ = unaff_R12;
    cmp._0_8_ = unaff_RBX;
    new._8_8_ = unaff_R14;
    new._0_8_ = unaff_R13;
    pIVar3 = atomic16_cmpxchg(ptr,ptr_00,(Int128)cmp,(Int128)new);
    bVar1 = pIVar3 != ptr_00;
    bVar2 = extraout_RDX != lVar4;
    ptr_00 = pIVar3;
    lVar4 = extraout_RDX;
  } while (bVar1 || bVar2);
  return;
}

Assistant:

static inline void atomic16_set(Int128 *ptr, Int128 val)
{
    Int128 old = *ptr, cmp;
    do {
        cmp = old;
        old = atomic16_cmpxchg(ptr, cmp, val);
#ifdef _MSC_VER
    } while (memcmp(&old, &cmp, sizeof(old)));
#else
    }